

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeLanguageCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_adbc45::cmCMakeLanguageCommandDEFER
               (Defer *defer,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args,size_t arg,cmExecutionStatus *status)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  ulong uVar4;
  char *pcVar5;
  string *psVar6;
  cmMakefile *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  cmMakefile *local_3f0;
  string_view local_3e8;
  string local_3d8;
  string_view local_3b8;
  string_view local_3a8;
  string_view local_398;
  string local_388;
  undefined1 local_368 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> call;
  string local_330;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  const_reference local_2c0;
  string *var_1;
  string local_2b0;
  const_reference local_290;
  string *id_1;
  string local_280;
  basic_string_view<char,_std::char_traits<char>_> local_260;
  size_t local_250;
  char *local_248;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_240;
  string_view local_230;
  undefined4 local_21c;
  string_view local_218;
  string_view local_208;
  string local_1f8;
  undefined1 local_1d8 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ids_1;
  string local_1a8;
  const_reference local_188;
  string *var;
  string local_178;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  size_t local_148;
  char *local_140;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_138;
  string_view local_128;
  string_view local_118;
  string local_108;
  string_view local_d8;
  string local_c8;
  reference local_a8;
  string *id;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin2;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range2;
  undefined1 local_78 [8];
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ids;
  cmMakefile *deferMakefile;
  cmExecutionStatus *status_local;
  size_t arg_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  Defer *defer_local;
  
  if (defer->Directory == (cmMakefile *)0x0) {
    local_3f0 = cmExecutionStatus::GetMakefile(status);
  }
  else {
    local_3f0 = defer->Directory;
  }
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,arg);
  __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar2);
  join_0x00000010_0x00000000_ =
       (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("CANCEL_CALL",0xb);
  bVar1 = std::operator==(__x,join_0x00000010_0x00000000_);
  if (bVar1) {
    ___range2 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          (args);
    _local_78 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&__range2,arg + 1);
    __end2 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_78);
    id = (string *)
         cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_78);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&id), bVar1) {
      local_a8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_a8);
      if (('@' < *pcVar5) &&
         (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_a8), *pcVar5 < '[')) {
        local_d8 = (string_view)::cm::operator____s("DEFER CANCEL_CALL unknown argument:\n  ",0x26);
        cmStrCat<cm::static_string_view,std::__cxx11::string_const&>
                  (&local_c8,(static_string_view *)&local_d8,local_a8);
        bVar1 = FatalError(status,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        return bVar1;
      }
      bVar1 = cmMakefile::DeferCancelCall(local_3f0,local_a8);
      if (!bVar1) {
        local_118 = (string_view)
                    ::cm::operator____s("DEFER CANCEL_CALL may not update directory:\n  ",0x2e);
        psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_3f0);
        local_128 = (string_view)::cm::operator____s("\nat this time.",0xe);
        cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
                  (&local_108,(static_string_view *)&local_118,psVar6,
                   (static_string_view *)&local_128);
        bVar1 = FatalError(status,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        return bVar1;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    defer_local._7_1_ = true;
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,arg);
    local_138 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar2);
    local_158 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("GET_CALL_IDS",0xc);
    local_148 = local_158._M_len;
    local_140 = local_158._M_str;
    bVar1 = std::operator==(local_138,local_158);
    if (bVar1) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args);
      if (arg + 1 == sVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,"DEFER GET_CALL_IDS missing output variable",
                   (allocator<char> *)((long)&var + 7));
        defer_local._7_1_ = FatalError(status,&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator((allocator<char> *)((long)&var + 7));
      }
      else {
        local_188 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](args,arg + 1);
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args);
        if (arg + 2 == sVar3) {
          cmMakefile::DeferGetCallIds_abi_cxx11_
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1d8,local_3f0);
          bVar1 = std::optional::operator_cast_to_bool((optional *)local_1d8);
          if (bVar1) {
            pcVar7 = cmExecutionStatus::GetMakefile(status);
            pvVar2 = local_188;
            pbVar8 = std::
                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_1d8);
            local_230 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar8);
            cmMakefile::AddDefinition(pcVar7,pvVar2,local_230);
            defer_local._7_1_ = true;
          }
          else {
            local_208 = (string_view)
                        ::cm::operator____s("DEFER GET_CALL_IDS may not access directory:\n  ",0x2f)
            ;
            psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_3f0);
            local_218 = (string_view)::cm::operator____s("\nat this time.",0xe);
            cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
                      (&local_1f8,(static_string_view *)&local_208,psVar6,
                       (static_string_view *)&local_218);
            defer_local._7_1_ = FatalError(status,&local_1f8);
            std::__cxx11::string::~string((string *)&local_1f8);
          }
          local_21c = 1;
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1d8);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a8,"DEFER GET_CALL_IDS given too many arguments",
                     (allocator<char> *)
                     &ids_1.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .field_0x27);
          defer_local._7_1_ = FatalError(status,&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     &ids_1.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .field_0x27);
        }
      }
    }
    else {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,arg);
      local_240 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar2);
      local_260 = (basic_string_view<char,_std::char_traits<char>_>)
                  ::cm::operator____s("GET_CALL",8);
      local_250 = local_260._M_len;
      local_248 = local_260._M_str;
      bVar1 = std::operator==(local_240,local_260);
      if (bVar1) {
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args);
        if (arg + 1 == sVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_280,"DEFER GET_CALL missing id",
                     (allocator<char> *)((long)&id_1 + 7));
          defer_local._7_1_ = FatalError(status,&local_280);
          std::__cxx11::string::~string((string *)&local_280);
          std::allocator<char>::~allocator((allocator<char> *)((long)&id_1 + 7));
        }
        else {
          local_290 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](args,arg + 1);
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if (arg + 2 == sVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2b0,"DEFER GET_CALL missing output variable",
                       (allocator<char> *)((long)&var_1 + 7));
            defer_local._7_1_ = FatalError(status,&local_2b0);
            std::__cxx11::string::~string((string *)&local_2b0);
            std::allocator<char>::~allocator((allocator<char> *)((long)&var_1 + 7));
          }
          else {
            local_2c0 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](args,arg + 2);
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(args);
            if (arg + 3 == sVar3) {
              uVar4 = std::__cxx11::string::empty();
              if ((uVar4 & 1) == 0) {
                pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_290);
                if ('@' < *pcVar5) {
                  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_290);
                  if (*pcVar5 < '[') {
                    join_0x00000010_0x00000000_ =
                         (string_view)
                         ::cm::operator____s("DEFER GET_CALL unknown argument:\n ",0x22);
                    cmStrCat<cm::static_string_view,std::__cxx11::string_const&>
                              (&local_330,
                               (static_string_view *)
                               &call.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_engaged,local_290);
                    bVar1 = FatalError(status,&local_330);
                    std::__cxx11::string::~string((string *)&local_330);
                    return bVar1;
                  }
                }
                cmMakefile::DeferGetCall
                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_368,local_3f0,local_290);
                bVar1 = std::optional::operator_cast_to_bool((optional *)local_368);
                if (bVar1) {
                  pcVar7 = cmExecutionStatus::GetMakefile(status);
                  pvVar2 = local_2c0;
                  pbVar8 = std::
                           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_368);
                  local_3b8 = (string_view)
                              std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)pbVar8);
                  cmMakefile::AddDefinition(pcVar7,pvVar2,local_3b8);
                  defer_local._7_1_ = true;
                }
                else {
                  local_398 = (string_view)
                              ::cm::operator____s("DEFER GET_CALL may not access directory:\n  ",
                                                  0x2b);
                  psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_3f0);
                  local_3a8 = (string_view)::cm::operator____s("\nat this time.",0xe);
                  cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
                            (&local_388,(static_string_view *)&local_398,psVar6,
                             (static_string_view *)&local_3a8);
                  defer_local._7_1_ = FatalError(status,&local_388);
                  std::__cxx11::string::~string((string *)&local_388);
                }
                local_21c = 1;
                std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_368);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_308,"DEFER GET_CALL id may not be empty",&local_309);
                defer_local._7_1_ = FatalError(status,&local_308);
                std::__cxx11::string::~string((string *)&local_308);
                std::allocator<char>::~allocator(&local_309);
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2e0,"DEFER GET_CALL given too many arguments",&local_2e1);
              defer_local._7_1_ = FatalError(status,&local_2e0);
              std::__cxx11::string::~string((string *)&local_2e0);
              std::allocator<char>::~allocator(&local_2e1);
            }
          }
        }
      }
      else {
        local_3e8 = (string_view)::cm::operator____s("DEFER operation unknown: ",0x19);
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,arg);
        cmStrCat<cm::static_string_view,std::__cxx11::string_const&>
                  (&local_3d8,(static_string_view *)&local_3e8,pvVar2);
        defer_local._7_1_ = FatalError(status,&local_3d8);
        std::__cxx11::string::~string((string *)&local_3d8);
      }
    }
  }
  return defer_local._7_1_;
}

Assistant:

bool cmCMakeLanguageCommandDEFER(Defer const& defer,
                                 std::vector<std::string> const& args,
                                 size_t arg, cmExecutionStatus& status)
{
  cmMakefile* deferMakefile =
    defer.Directory ? defer.Directory : &status.GetMakefile();
  if (args[arg] == "CANCEL_CALL"_s) {
    ++arg; // Consume CANCEL_CALL.
    auto ids = cmMakeRange(args).advance(arg);
    for (std::string const& id : ids) {
      if (id[0] >= 'A' && id[0] <= 'Z') {
        return FatalError(
          status, cmStrCat("DEFER CANCEL_CALL unknown argument:\n  "_s, id));
      }
      if (!deferMakefile->DeferCancelCall(id)) {
        return FatalError(
          status,
          cmStrCat("DEFER CANCEL_CALL may not update directory:\n  "_s,
                   deferMakefile->GetCurrentBinaryDirectory(),
                   "\nat this time."_s));
      }
    }
    return true;
  }
  if (args[arg] == "GET_CALL_IDS"_s) {
    ++arg; // Consume GET_CALL_IDS.
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL_IDS missing output variable");
    }
    std::string const& var = args[arg++];
    if (arg != args.size()) {
      return FatalError(status, "DEFER GET_CALL_IDS given too many arguments");
    }
    cm::optional<std::string> ids = deferMakefile->DeferGetCallIds();
    if (!ids) {
      return FatalError(
        status,
        cmStrCat("DEFER GET_CALL_IDS may not access directory:\n  "_s,
                 deferMakefile->GetCurrentBinaryDirectory(),
                 "\nat this time."_s));
    }
    status.GetMakefile().AddDefinition(var, *ids);
    return true;
  }
  if (args[arg] == "GET_CALL"_s) {
    ++arg; // Consume GET_CALL.
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL missing id");
    }
    std::string const& id = args[arg++];
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL missing output variable");
    }
    std::string const& var = args[arg++];
    if (arg != args.size()) {
      return FatalError(status, "DEFER GET_CALL given too many arguments");
    }
    if (id.empty()) {
      return FatalError(status, "DEFER GET_CALL id may not be empty");
    }
    if (id[0] >= 'A' && id[0] <= 'Z') {
      return FatalError(status,
                        cmStrCat("DEFER GET_CALL unknown argument:\n "_s, id));
    }
    cm::optional<std::string> call = deferMakefile->DeferGetCall(id);
    if (!call) {
      return FatalError(
        status,
        cmStrCat("DEFER GET_CALL may not access directory:\n  "_s,
                 deferMakefile->GetCurrentBinaryDirectory(),
                 "\nat this time."_s));
    }
    status.GetMakefile().AddDefinition(var, *call);
    return true;
  }
  return FatalError(status,
                    cmStrCat("DEFER operation unknown: "_s, args[arg]));
}